

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_time(archive_write *a,uint8_t type,uint flg,int ti)

{
  uint64_t u;
  ssize_t sVar1;
  byte local_46;
  byte local_45;
  int local_44;
  uint8_t mask;
  uint8_t b;
  file *pfStack_40;
  int r;
  file *file;
  _7zip *zip;
  uint8_t filetime [8];
  int ti_local;
  uint flg_local;
  uint8_t type_local;
  archive_write *a_local;
  
  file = (file *)a->format_data;
  filetime._0_4_ = ti;
  filetime._4_4_ = flg;
  if ((file *)(&file->times[0].time)[ti] == file->next) {
    local_44 = enc_uint64(a,(ulong)type);
    if (local_44 < 0) {
      return local_44;
    }
    local_44 = enc_uint64(a,(long)file->next * 8 + 2);
    if (local_44 < 0) {
      return local_44;
    }
    local_44 = enc_uint64(a,1);
  }
  else {
    if ((&file->times[0].time)[ti] == 0) {
      return 0;
    }
    local_44 = enc_uint64(a,(ulong)type);
    if (local_44 < 0) {
      return local_44;
    }
    local_44 = enc_uint64(a,((ulong)((long)(file->next->rbnode).rb_nodes + 7U) >> 3) + 2 +
                            (&file->times[0].time)[(int)filetime._0_4_] * 8);
    if (local_44 < 0) {
      return local_44;
    }
    local_44 = enc_uint64(a,0);
    if (local_44 < 0) {
      return local_44;
    }
    local_45 = 0;
    local_46 = 0x80;
    for (pfStack_40 = file[0x1e2].next; pfStack_40 != (file *)0x0; pfStack_40 = pfStack_40->next) {
      if ((pfStack_40->flg & filetime._4_4_) != 0) {
        local_45 = local_45 | local_46;
      }
      local_46 = (byte)((int)(uint)local_46 >> 1);
      if (local_46 == 0) {
        sVar1 = compress_out(a,&local_45,1,ARCHIVE_Z_RUN);
        local_44 = (int)sVar1;
        if (local_44 < 0) {
          return local_44;
        }
        local_46 = 0x80;
        local_45 = 0;
      }
    }
    if (local_46 == 0x80) goto LAB_00183c33;
    sVar1 = compress_out(a,&local_45,1,ARCHIVE_Z_RUN);
    local_44 = (int)sVar1;
  }
  if (local_44 < 0) {
    return local_44;
  }
LAB_00183c33:
  local_44 = enc_uint64(a,0);
  a_local._4_4_ = local_44;
  if (-1 < local_44) {
    for (pfStack_40 = file[0x1e2].next; pfStack_40 != (file *)0x0; pfStack_40 = pfStack_40->next) {
      if ((pfStack_40->flg & filetime._4_4_) != 0) {
        u = unix_to_ntfs(pfStack_40->times[(int)filetime._0_4_].time,
                         (uint32_t)pfStack_40->times[(int)filetime._0_4_].time_ns);
        archive_le64enc((void *)((long)&zip + 4),u);
        sVar1 = compress_out(a,(void *)((long)&zip + 4),8,ARCHIVE_Z_RUN);
        local_44 = (int)sVar1;
        if (local_44 < 0) {
          return local_44;
        }
      }
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
make_time(struct archive_write *a, uint8_t type, unsigned flg, int ti)
{
	uint8_t filetime[8];
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;
	uint8_t b, mask;

	/*
	 * Make Time Bools.
	 */
	if (zip->total_number_time_defined[ti] == zip->total_number_entry) {
		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + zip->total_number_entry * 8);
		if (r < 0)
			return (r);
		/* All are defined. */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
	} else {
		if (zip->total_number_time_defined[ti] == 0)
			return (ARCHIVE_OK);

		/* Write Time Type. */
		r = enc_uint64(a, type);
		if (r < 0)
			return (r);
		/* Write EmptyStream Size. */
		r = enc_uint64(a, 2 + ((zip->total_number_entry + 7) >> 3)
			+ zip->total_number_time_defined[ti] * 8);
		if (r < 0)
			return (r);

		/* All are not defined. */
		r = enc_uint64(a, 0);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->flg & flg)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	/* External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	/*
	 * Make Times.
	 */
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		if ((file->flg & flg) == 0)
			continue;
		archive_le64enc(filetime, unix_to_ntfs(file->times[ti].time,
			file->times[ti].time_ns));
		r = (int)compress_out(a, filetime, 8, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}